

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O3

bool __thiscall wasm::DAE::iteration(DAE *this,Module *module,DAEFunctionInfoMap *infoMap)

{
  _Rb_tree_node_base *__k;
  __node_base_ptr *pp_Var1;
  __node_base_ptr *__dest;
  Index x;
  _Hash_node_base *p_Var2;
  mapped_type ppEVar3;
  long *plVar4;
  _Base_ptr p_Var5;
  pointer ppCVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  __node_base _Var10;
  __node_base _Var11;
  __node_base _Var12;
  bool bVar13;
  vector<wasm::Call*,std::allocator<wasm::Call*>> *pvVar14;
  mapped_type *pmVar15;
  mapped_type *pppEVar16;
  size_type sVar17;
  Function *func_00;
  mapped_type *pmVar18;
  _Base_ptr p_Var19;
  undefined8 extraout_RAX;
  _Rb_tree_node_base *p_Var20;
  size_t sVar21;
  iterator iVar22;
  __normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_> _Var23
  ;
  byte bVar24;
  _Hash_node_base *p_Var25;
  Call *pCVar26;
  __node_base_ptr p_Var27;
  Module *this_00;
  long lVar28;
  _Hash_node_base *p_Var29;
  size_t *this_01;
  long *plVar30;
  vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *pvVar31;
  _Base_ptr p_Var32;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *curr;
  DAE *pDVar33;
  pointer ppCVar34;
  Signature SVar35;
  initializer_list<wasm::Function_*> __l;
  initializer_list<wasm::Function_*> __l_00;
  undefined1 local_4d8 [8];
  DAEScanner scanner;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  tailCallees;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  callTargetsToLocalize;
  SortedVector optimizedIndexes;
  void *local_220;
  long local_210;
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1f8;
  undefined1 local_1c0 [8];
  unordered_map<wasm::Expression_*,_wasm::Name,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>_>
  expressionFuncs;
  undefined1 local_168 [8];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  hasUnseenCalls;
  unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
  worthOptimizing;
  map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
  allCalls;
  long local_b8;
  Function *local_b0;
  __node_base local_a8;
  anon_class_8_1_f74e94ae markStale;
  vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> local_98;
  _Map_base<wasm::Call_*,_std::pair<wasm::Call_*const,_wasm::Expression_**>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Call_*>,_std::hash<wasm::Call_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_80;
  vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *__range3;
  DAE *local_70;
  undefined1 auStack_68 [8];
  Name name;
  Function *local_48;
  Function *func;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2;
  
  local_80 = (_Map_base<wasm::Call_*,_std::pair<wasm::Call_*const,_wasm::Expression_**>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Call_*>,_std::hash<wasm::Call_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->allDroppedCalls;
  std::
  _Hashtable<wasm::Call_*,_std::pair<wasm::Call_*const,_wasm::Expression_**>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Call_*>,_std::hash<wasm::Call_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear((_Hashtable<wasm::Call_*,_std::pair<wasm::Call_*const,_wasm::Expression_**>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Call_*>,_std::hash<wasm::Call_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)local_80);
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_Pass.runner =
       (PassRunner *)
       &scanner.
        super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
        .super_Pass.name._M_string_length;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_Pass._vptr_Pass = (_func_int **)0x0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_Pass.name._M_dataplus._M_p = (pointer)0x0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_Pass.name._M_string_length._0_1_ = 0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_Pass.passArg.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_1_ = 0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_Pass.passArg.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_Pass.passArg.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._33_7_ = 0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
  super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.replacep =
       (Expression **)0x0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
  super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.stack.fixed._M_elems[9].
  currp = (Expression **)0x0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
  super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
  super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
  super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
  super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.currFunction =
       (Function *)0x0;
  local_4d8 = (undefined1  [8])&PTR__WalkerPass_01071f30;
  scanner.infoMap = (DAEFunctionInfoMap *)0x0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
  super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.currModule =
       (Module *)infoMap;
  markStale.infoMap = infoMap;
  Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::walkModuleCode
            ((Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_> *)
             ((long)&scanner.
                     super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                     .super_Pass.passArg.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             + 0x20),module);
  WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>::run
            ((WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
              *)local_4d8,(this->super_Pass).runner,module);
  allCalls._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&allCalls;
  allCalls._M_t._M_impl._0_4_ = 0;
  allCalls._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  allCalls._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  allCalls._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  scanner.info = (DAEFunctionInfo *)&tailCallees._M_h._M_rehash_policy._M_next_resize;
  tailCallees._M_h._M_buckets = (__buckets_ptr)0x1;
  tailCallees._M_h._M_bucket_count = 0;
  tailCallees._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  tailCallees._M_h._M_element_count._0_4_ = 0x3f800000;
  tailCallees._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  tailCallees._M_h._M_rehash_policy._4_4_ = 0;
  tailCallees._M_h._M_rehash_policy._M_next_resize = 0;
  local_168 = (undefined1  [8])&hasUnseenCalls._M_h._M_rehash_policy._M_next_resize;
  hasUnseenCalls._M_h._M_buckets = (__buckets_ptr)0x1;
  hasUnseenCalls._M_h._M_bucket_count = 0;
  hasUnseenCalls._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  hasUnseenCalls._M_h._M_element_count._0_4_ = 0x3f800000;
  hasUnseenCalls._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  hasUnseenCalls._M_h._M_rehash_policy._4_4_ = 0;
  hasUnseenCalls._M_h._M_rehash_policy._M_next_resize = 0;
  local_1c0 = (undefined1  [8])&expressionFuncs._M_h._M_rehash_policy._M_next_resize;
  expressionFuncs._M_h._M_buckets = (__buckets_ptr)0x1;
  expressionFuncs._M_h._M_bucket_count = 0;
  expressionFuncs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  expressionFuncs._M_h._M_element_count._0_4_ = 0x3f800000;
  expressionFuncs._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  expressionFuncs._M_h._M_rehash_policy._4_4_ = 0;
  expressionFuncs._M_h._M_rehash_policy._M_next_resize = 0;
  pvVar31 = (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)
            ((markStale.infoMap)->_M_h)._M_before_begin._M_nxt;
  allCalls._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       allCalls._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_70 = this;
  func = (Function *)module;
  if (pvVar31 != (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)0x0) {
    pp_Var1 = &callTargetsToLocalize._M_h._M_single_bucket;
    do {
      p_Var25 = (_Hash_node_base *)
                pvVar31[3].super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      __range3 = pvVar31;
      if (p_Var25 != (_Hash_node_base *)0x0) {
        do {
          pvVar14 = (vector<wasm::Call*,std::allocator<wasm::Call*>> *)
                    std::
                    map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
                    ::operator[]((map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
                                  *)&worthOptimizing._M_h._M_single_bucket,(key_type *)(p_Var25 + 1)
                                );
          std::vector<wasm::Call*,std::allocator<wasm::Call*>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<wasm::Call**,std::vector<wasm::Call*,std::allocator<wasm::Call*>>>>
                    (pvVar14,*(undefined8 *)(pvVar14 + 8),p_Var25[3]._M_nxt,p_Var25[4]._M_nxt);
          p_Var2 = p_Var25[4]._M_nxt;
          for (p_Var29 = p_Var25[3]._M_nxt; p_Var29 != p_Var2; p_Var29 = p_Var29 + 1) {
            callTargetsToLocalize._M_h._M_single_bucket = p_Var29->_M_nxt;
            pmVar15 = std::__detail::
                      _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Name>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Name>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)local_1c0,(key_type *)pp_Var1);
            uVar7 = *(undefined4 *)
                     ((long)&(pvVar31->
                             super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish + 4);
            uVar8 = *(undefined4 *)
                     &(pvVar31->super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>).
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
            uVar9 = *(undefined4 *)
                     ((long)&(pvVar31->
                             super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>).
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
            *(undefined4 *)&(pmVar15->super_IString).str._M_len =
                 *(undefined4 *)
                  &(pvVar31->super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
            *(undefined4 *)((long)&(pmVar15->super_IString).str._M_len + 4) = uVar7;
            *(undefined4 *)&(pmVar15->super_IString).str._M_str = uVar8;
            *(undefined4 *)((long)&(pmVar15->super_IString).str._M_str + 4) = uVar9;
          }
          p_Var25 = p_Var25->_M_nxt;
        } while (p_Var25 != (_Hash_node_base *)0x0);
      }
      pvVar31 = __range3;
      for (pCVar26 = (Call *)__range3[8].
                             super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>._M_impl
                             .super__Vector_impl_data._M_start; pCVar26 != (Call *)0x0;
          pCVar26 = *(Call **)&pCVar26->super_SpecificExpression<(wasm::Expression::Id)6>) {
        callTargetsToLocalize._M_h._M_single_bucket = (__node_base_ptr)&scanner.info;
        std::
        _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                  ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)callTargetsToLocalize._M_h._M_single_bucket,
                   (pointer)((long)&pCVar26->super_SpecificExpression<(wasm::Expression::Id)6> + 8),
                   pp_Var1);
      }
      for (pCVar26 = (Call *)pvVar31[5].
                             super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>._M_impl
                             .super__Vector_impl_data._M_finish; pvVar31 = __range3,
          pCVar26 != (Call *)0x0;
          pCVar26 = *(Call **)&pCVar26->super_SpecificExpression<(wasm::Expression::Id)6>) {
        ppEVar3 = *(mapped_type *)&pCVar26->operands;
        pppEVar16 = std::__detail::
                    _Map_base<wasm::Call_*,_std::pair<wasm::Call_*const,_wasm::Expression_**>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Call_*>,_std::hash<wasm::Call_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[](local_80,(key_type *)
                                          ((long)&pCVar26->
                                                  super_SpecificExpression<(wasm::Expression::Id)6>
                                          + 8));
        *pppEVar16 = ppEVar3;
      }
      for (pCVar26 = (Call *)__range3[10].
                             super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>._M_impl
                             .super__Vector_impl_data._M_finish; pCVar26 != (Call *)0x0;
          pCVar26 = *(Call **)&pCVar26->super_SpecificExpression<(wasm::Expression::Id)6>) {
        callTargetsToLocalize._M_h._M_single_bucket = (__node_base_ptr)local_168;
        std::
        _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                  ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)callTargetsToLocalize._M_h._M_single_bucket,
                   (pointer)((long)&pCVar26->super_SpecificExpression<(wasm::Expression::Id)6> + 8),
                   pp_Var1);
      }
      pvVar31 = (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)
                (pvVar31->super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (pvVar31 != (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)0x0);
  }
  plVar30 = (long *)(func->super_Importable).super_Named.name.super_IString.str._M_len;
  plVar4 = (long *)(func->super_Importable).super_Named.name.super_IString.str._M_str;
  if (plVar30 != plVar4) {
    do {
      lVar28 = *plVar30;
      if (*(int *)(lVar28 + 0x10) == 0) {
        if (*(char *)(lVar28 + 0x28) == '\0') {
          lVar28 = lVar28 + 0x18;
        }
        else {
          lVar28 = 0;
        }
        callTargetsToLocalize._M_h._M_single_bucket = (__node_base_ptr)local_168;
        std::
        _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                  ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)local_168,lVar28,&callTargetsToLocalize._M_h._M_single_bucket);
      }
      plVar30 = plVar30 + 1;
    } while (plVar30 != plVar4);
  }
  hasUnseenCalls._M_h._M_single_bucket =
       (__node_base_ptr)&worthOptimizing._M_h._M_rehash_policy._M_next_resize;
  worthOptimizing._M_h._M_buckets = (__buckets_ptr)0x1;
  worthOptimizing._M_h._M_bucket_count = 0;
  worthOptimizing._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  worthOptimizing._M_h._M_element_count._0_4_ = 0x3f800000;
  worthOptimizing._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  worthOptimizing._M_h._M_rehash_policy._4_4_ = 0;
  worthOptimizing._M_h._M_rehash_policy._M_next_resize = 0;
  tailCallees._M_h._M_single_bucket =
       (__node_base_ptr)&callTargetsToLocalize._M_h._M_rehash_policy._M_next_resize;
  callTargetsToLocalize._M_h._M_buckets = (__buckets_ptr)0x1;
  callTargetsToLocalize._M_h._M_bucket_count = 0;
  callTargetsToLocalize._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  callTargetsToLocalize._M_h._M_element_count._0_4_ = 0x3f800000;
  callTargetsToLocalize._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  callTargetsToLocalize._M_h._M_rehash_policy._4_4_ = 0;
  callTargetsToLocalize._M_h._M_rehash_policy._M_next_resize = 0;
  local_a8._M_nxt = (_Hash_node_base *)markStale.infoMap;
  if (allCalls._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)&allCalls) {
    __range3 = (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)
               ((ulong)__range3 & 0xffffffff00000000);
    this_00 = (Module *)func;
    p_Var19 = allCalls._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      p_Var20 = p_Var19 + 1;
      sVar17 = std::
               _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        *)local_168,(key_type *)p_Var20);
      if (sVar17 == 0) {
        func_00 = Module::getFunction(this_00,(Name)*(string_view *)(p_Var19 + 1));
        local_48 = func_00;
        pmVar18 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)markStale.infoMap,(key_type *)p_Var20);
        local_80 = (_Map_base<wasm::Call_*,_std::pair<wasm::Call_*const,_wasm::Expression_**>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Call_*>,_std::hash<wasm::Call_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&p_Var19[1]._M_left;
        bVar13 = refineArgumentTypes(local_70,func_00,
                                     (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)local_80
                                     ,this_00,pmVar18);
        if (bVar13) {
          callTargetsToLocalize._M_h._M_single_bucket =
               (__node_base_ptr)&hasUnseenCalls._M_h._M_single_bucket;
          std::
          _Hashtable<wasm::Function*,wasm::Function*,std::allocator<wasm::Function*>,std::__detail::_Identity,std::equal_to<wasm::Function*>,std::hash<wasm::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<wasm::Function*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Function*,false>>>>
                    ((_Hashtable<wasm::Function*,wasm::Function*,std::allocator<wasm::Function*>,std::__detail::_Identity,std::equal_to<wasm::Function*>,std::hash<wasm::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)callTargetsToLocalize._M_h._M_single_bucket,&local_48,
                     &callTargetsToLocalize._M_h._M_single_bucket);
          callTargetsToLocalize._M_h._M_single_bucket =
               (__node_base_ptr)
               (local_48->super_Importable).super_Named.name.super_IString.str._M_len;
          optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)(local_48->super_Importable).super_Named.name.super_IString.str._M_str;
          if (optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_0082d17e;
          pmVar18 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_a8._M_nxt,
                                 (key_type *)&callTargetsToLocalize._M_h._M_single_bucket);
          pmVar18->stale = true;
        }
        bVar13 = refineReturnTypes(local_70,local_48,
                                   (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)local_80,
                                   this_00);
        _Var12._M_nxt = local_a8._M_nxt;
        if (bVar13) {
          callTargetsToLocalize._M_h._M_single_bucket =
               (__node_base_ptr)
               (local_48->super_Importable).super_Named.name.super_IString.str._M_len;
          optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)(local_48->super_Importable).super_Named.name.super_IString.str._M_str;
          if (optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_0082d17e;
          pmVar18 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_a8._M_nxt,
                                 (key_type *)&callTargetsToLocalize._M_h._M_single_bucket);
          pmVar18->stale = true;
          p_Var32 = p_Var19[1]._M_left;
          p_Var5 = p_Var19[1]._M_right;
          __range3 = (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)
                     CONCAT44(__range3._4_4_,(int)CONCAT71((int7)((ulong)pmVar18 >> 8),1));
          for (; this_00 = (Module *)func, p_Var32 != p_Var5;
              p_Var32 = (_Base_ptr)&p_Var32->_M_parent) {
            auStack_68 = *(undefined1 (*) [8])p_Var32;
            pmVar15 = std::__detail::
                      _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Name>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Name>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)local_1c0,(key_type *)auStack_68);
            callTargetsToLocalize._M_h._M_single_bucket =
                 (__node_base_ptr)(pmVar15->super_IString).str._M_len;
            optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)(pmVar15->super_IString).str._M_str;
            if (optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_0082d17e;
            pmVar18 = std::__detail::
                      _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)_Var12._M_nxt,
                                   (key_type *)&callTargetsToLocalize._M_h._M_single_bucket);
            pmVar18->stale = true;
          }
        }
        local_b0 = local_48;
        __l._M_len = 1;
        __l._M_array = &local_b0;
        std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::vector
                  ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)auStack_68,__l,
                   (allocator_type *)((long)&__range2 + 7));
        local_98.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_98.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_98.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ParamUtils::applyConstantValues
                  ((SortedVector *)&callTargetsToLocalize._M_h._M_single_bucket,
                   (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)auStack_68,
                   (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)local_80,&local_98,this_00
                  );
        if ((Function *)
            local_98.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
            super__Vector_impl_data._M_start != (Function *)0x0) {
          operator_delete(local_98.
                          super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_98.
                                super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_98.
                                super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (auStack_68 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_68,(long)name.super_IString.str._M_str - (long)auStack_68)
          ;
        }
        p_Var27 = callTargetsToLocalize._M_h._M_single_bucket;
        if (callTargetsToLocalize._M_h._M_single_bucket !=
            (__node_base_ptr)
            optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          do {
            x = *(Index *)&p_Var27->_M_nxt;
            pmVar18 = std::__detail::
                      _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)markStale.infoMap,(key_type *)p_Var20);
            SortedVector::insert(&pmVar18->unusedParams,x);
            p_Var27 = (__node_base_ptr)((long)&p_Var27->_M_nxt + 4);
          } while (p_Var27 !=
                   (__node_base_ptr)
                   optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start);
          if (callTargetsToLocalize._M_h._M_single_bucket !=
              (__node_base_ptr)
              optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            auStack_68 = (undefined1  [8])
                         (local_48->super_Importable).super_Named.name.super_IString.str._M_len;
            name.super_IString.str._M_len =
                 (size_t)(local_48->super_Importable).super_Named.name.super_IString.str._M_str;
            if ((char *)name.super_IString.str._M_len == (char *)0x0) goto LAB_0082d17e;
            pmVar18 = std::__detail::
                      _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)local_a8._M_nxt,(key_type *)auStack_68);
            pmVar18->stale = true;
          }
        }
        this_00 = (Module *)func;
        if (callTargetsToLocalize._M_h._M_single_bucket != (__node_base_ptr)0x0) {
          operator_delete(callTargetsToLocalize._M_h._M_single_bucket,
                          (long)optimizedIndexes.
                                super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)callTargetsToLocalize._M_h._M_single_bucket);
          this_00 = (Module *)func;
        }
      }
      p_Var19 = (_Base_ptr)std::_Rb_tree_increment(p_Var19);
    } while (p_Var19 != (_Rb_tree_node_base *)&allCalls);
    if (((ulong)__range3 & 1) != 0) {
      ReFinalize::ReFinalize((ReFinalize *)&callTargetsToLocalize._M_h._M_single_bucket);
      pDVar33 = local_70;
      WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
      ::run((WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
             *)&callTargetsToLocalize._M_h._M_single_bucket,(local_70->super_Pass).runner,this_00);
      callTargetsToLocalize._M_h._M_single_bucket = (__node_base_ptr)&PTR__ReFinalize_01070c30;
      std::
      _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_1f8);
      if (local_220 != (void *)0x0) {
        operator_delete(local_220,local_210 - (long)local_220);
      }
      Pass::~Pass((Pass *)&callTargetsToLocalize._M_h._M_single_bucket);
      local_80 = (_Map_base<wasm::Call_*,_std::pair<wasm::Call_*const,_wasm::Expression_**>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Call_*>,_std::hash<wasm::Call_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)CONCAT44(local_80._4_4_,(int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1));
      goto LAB_0082cbe9;
    }
  }
  local_80 = (_Map_base<wasm::Call_*,_std::pair<wasm::Call_*const,_wasm::Expression_**>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Call_*>,_std::hash<wasm::Call_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)((ulong)local_80 & 0xffffffff00000000);
  pDVar33 = local_70;
LAB_0082cbe9:
  p_Var20 = allCalls._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (allCalls._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)&allCalls) {
    do {
      this_01 = &allCalls._M_t._M_impl.super__Rb_tree_header._M_node_count;
      __k = p_Var20 + 1;
      sVar17 = std::
               _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        *)local_168,(key_type *)__k);
      if (sVar17 == 0) {
        local_48 = Module::getFunction((Module *)func,(Name)*(string_view *)(p_Var20 + 1));
        sVar21 = Function::getNumParams(local_48);
        if (sVar21 != 0) {
          local_b0 = local_48;
          __l_00._M_len = 1;
          __l_00._M_array = &local_b0;
          std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::vector
                    ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)auStack_68,
                     __l_00,(allocator_type *)((long)&__range2 + 7));
          pmVar18 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)markStale.infoMap,(key_type *)__k);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01,
                     &(pmVar18->unusedParams).
                      super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
          local_98.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_98.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_98.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ParamUtils::removeParameters
                    ((pair<wasm::SortedVector,_wasm::ParamUtils::RemovalOutcome> *)
                     &callTargetsToLocalize._M_h._M_single_bucket,
                     (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)auStack_68,
                     (SortedVector *)this_01,
                     (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)&p_Var20[1]._M_left,
                     &local_98,(Module *)func,(pDVar33->super_Pass).runner);
          if ((Function *)
              local_98.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl
              .super__Vector_impl_data._M_start != (Function *)0x0) {
            operator_delete(local_98.
                            super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_98.
                                  super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_98.
                                  super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (allCalls._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            operator_delete((void *)allCalls._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            local_b8 - allCalls._M_t._M_impl.super__Rb_tree_header._M_node_count);
          }
          if (auStack_68 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_68,
                            (long)name.super_IString.str._M_str - (long)auStack_68);
          }
          if (callTargetsToLocalize._M_h._M_single_bucket !=
              (__node_base_ptr)
              optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            auStack_68 = (undefined1  [8])&hasUnseenCalls._M_h._M_single_bucket;
            std::
            _Hashtable<wasm::Function*,wasm::Function*,std::allocator<wasm::Function*>,std::__detail::_Identity,std::equal_to<wasm::Function*>,std::hash<wasm::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<wasm::Function*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Function*,false>>>>
                      ((_Hashtable<wasm::Function*,wasm::Function*,std::allocator<wasm::Function*>,std::__detail::_Identity,std::equal_to<wasm::Function*>,std::hash<wasm::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)auStack_68,&local_48,auStack_68);
            _Var12._M_nxt = local_a8._M_nxt;
            auStack_68 = (undefined1  [8])
                         (local_48->super_Importable).super_Named.name.super_IString.str._M_len;
            name.super_IString.str._M_len =
                 (size_t)(local_48->super_Importable).super_Named.name.super_IString.str._M_str;
            if ((char *)name.super_IString.str._M_len == (char *)0x0) goto LAB_0082d17e;
            pmVar18 = std::__detail::
                      _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)local_a8._M_nxt,(key_type *)auStack_68);
            pmVar18->stale = true;
            p_Var32 = p_Var20[1]._M_right;
            for (p_Var19 = p_Var20[1]._M_left; p_Var19 != p_Var32;
                p_Var19 = (_Base_ptr)&p_Var19->_M_parent) {
              local_98.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl
              .super__Vector_impl_data._M_start = *(pointer *)p_Var19;
              pmVar15 = std::__detail::
                        _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Name>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Name>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)local_1c0,(key_type *)&local_98);
              auStack_68 = (undefined1  [8])(pmVar15->super_IString).str._M_len;
              name.super_IString.str._M_len = (size_t)(pmVar15->super_IString).str._M_str;
              if ((char *)name.super_IString.str._M_len == (char *)0x0) goto LAB_0082d17e;
              pmVar18 = std::__detail::
                        _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)_Var12._M_nxt,(key_type *)auStack_68);
              pmVar18->stale = true;
            }
          }
          if ((int)optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage == 1) {
            auStack_68 = (undefined1  [8])&tailCallees._M_h._M_single_bucket;
            std::
            _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                      ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)auStack_68,__k,auStack_68);
          }
          pDVar33 = local_70;
          if (callTargetsToLocalize._M_h._M_single_bucket != (__node_base_ptr)0x0) {
            operator_delete(callTargetsToLocalize._M_h._M_single_bucket,
                            (long)optimizedIndexes.
                                  super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)callTargetsToLocalize._M_h._M_single_bucket);
          }
        }
      }
      p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20);
    } while (p_Var20 != (_Rb_tree_node_base *)&allCalls);
  }
  if (worthOptimizing._M_h._M_before_begin._M_nxt == (_Hash_node_base *)0x0) {
    plVar4 = (long *)(func->super_Importable).module.super_IString.str._M_str;
    for (plVar30 = (long *)(func->super_Importable).module.super_IString.str._M_len;
        plVar30 != plVar4; plVar30 = plVar30 + 1) {
      SVar35 = HeapType::getSignature((HeapType *)(*plVar30 + 0x38));
      if (SVar35.results.id.id != 0) {
        auStack_68 = *(undefined1 (*) [8])*plVar30;
        name.super_IString.str._M_len = ((size_t *)*plVar30)[1];
        sVar17 = std::
                 _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)local_168,(key_type *)auStack_68);
        pDVar33 = local_70;
        if ((((sVar17 == 0) &&
             (pmVar18 = std::__detail::
                        _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)markStale.infoMap,(key_type *)auStack_68),
             pDVar33 = local_70, pmVar18->hasTailCalls == false)) &&
            (sVar17 = std::
                      _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                               *)&scanner.info,(key_type *)auStack_68), pDVar33 = local_70,
            sVar17 == 0)) &&
           ((iVar22 = std::
                      _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
                      ::find((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
                              *)&worthOptimizing._M_h._M_single_bucket,(key_type *)auStack_68),
            pDVar33 = local_70, iVar22._M_node != (_Base_ptr)&allCalls &&
            (p_Var19 = iVar22._M_node[1]._M_right,
            _Var23 = std::
                     __find_if<__gnu_cxx::__normal_iterator<wasm::Call**,std::vector<wasm::Call*,std::allocator<wasm::Call*>>>,__gnu_cxx::__ops::_Iter_negate<wasm::DAE::iteration(wasm::Module*,std::unordered_map<wasm::Name,wasm::DAEFunctionInfo,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::DAEFunctionInfo>>>&)::_lambda(wasm::Call*)_1_>>
                               (iVar22._M_node[1]._M_left,p_Var19,local_70), pDVar33 = local_70,
            (_Base_ptr)_Var23._M_current == p_Var19)))) {
          bVar13 = removeReturnValue(local_70,(Function *)*plVar30,
                                     (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)
                                     &iVar22._M_node[1]._M_left,(Module *)func);
          pp_Var1 = &hasUnseenCalls._M_h._M_single_bucket;
          __range3 = (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)iVar22;
          if (bVar13) {
            p_Var32 = iVar22._M_node[1]._M_right;
            for (p_Var19 = iVar22._M_node[1]._M_left; p_Var19 != p_Var32;
                p_Var19 = (_Base_ptr)&p_Var19->_M_parent) {
              local_48 = *(Function **)p_Var19;
              pmVar15 = std::__detail::
                        _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Name>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Name>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)local_1c0,(key_type *)&local_48);
              local_98.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl
              .super__Vector_impl_data._M_start =
                   (pointer)Module::getFunction((Module *)func,(Name)(pmVar15->super_IString).str);
              callTargetsToLocalize._M_h._M_single_bucket = (__node_base_ptr)pp_Var1;
              std::
              _Hashtable<wasm::Function*,wasm::Function*,std::allocator<wasm::Function*>,std::__detail::_Identity,std::equal_to<wasm::Function*>,std::hash<wasm::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_insert<wasm::Function*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Function*,false>>>>
                        ((_Hashtable<wasm::Function*,wasm::Function*,std::allocator<wasm::Function*>,std::__detail::_Identity,std::equal_to<wasm::Function*>,std::hash<wasm::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)pp_Var1,&local_98,&callTargetsToLocalize._M_h._M_single_bucket);
            }
          }
          local_98.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)*plVar30;
          callTargetsToLocalize._M_h._M_single_bucket = (__node_base_ptr)pp_Var1;
          std::
          _Hashtable<wasm::Function*,wasm::Function*,std::allocator<wasm::Function*>,std::__detail::_Identity,std::equal_to<wasm::Function*>,std::hash<wasm::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<wasm::Function*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Function*,false>>>>
                    ((_Hashtable<wasm::Function*,wasm::Function*,std::allocator<wasm::Function*>,std::__detail::_Identity,std::equal_to<wasm::Function*>,std::hash<wasm::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)pp_Var1,&local_98,&callTargetsToLocalize._M_h._M_single_bucket);
          pvVar31 = __range3;
          _Var12._M_nxt = local_a8._M_nxt;
          callTargetsToLocalize._M_h._M_single_bucket = *(__node_base_ptr *)*plVar30;
          if (((undefined8 *)*plVar30)[1] == 0) {
LAB_0082d17e:
            __assert_fail("func.is()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DeadArgumentElimination.cpp"
                          ,0x123,
                          "auto wasm::DAE::iteration(Module *, DAEFunctionInfoMap &)::(anonymous class)::operator()(Name) const"
                         );
          }
          pmVar18 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_a8._M_nxt,
                                 (key_type *)&callTargetsToLocalize._M_h._M_single_bucket);
          pmVar18->stale = true;
          ppCVar6 = pvVar31[2].super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          for (ppCVar34 = pvVar31[2].super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; pDVar33 = local_70,
              ppCVar34 != ppCVar6; ppCVar34 = ppCVar34 + 1) {
            local_98.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)*ppCVar34;
            pmVar15 = std::__detail::
                      _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Name>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Name>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)local_1c0,(key_type *)&local_98);
            callTargetsToLocalize._M_h._M_single_bucket =
                 (__node_base_ptr)(pmVar15->super_IString).str._M_len;
            if ((pmVar15->super_IString).str._M_str == (char *)0x0) goto LAB_0082d17e;
            pmVar18 = std::__detail::
                      _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)_Var12._M_nxt,
                                   (key_type *)&callTargetsToLocalize._M_h._M_single_bucket);
            pmVar18->stale = true;
          }
        }
      }
    }
  }
  if (callTargetsToLocalize._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    expressionFuncs._M_h._M_single_bucket = &local_a8;
    ParamUtils::localizeCallsTo
              ((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                *)&tailCallees._M_h._M_single_bucket,(Module *)func,(pDVar33->super_Pass).runner,
               (function<void_(wasm::Function_*)> *)&expressionFuncs._M_h._M_single_bucket);
    __dest = &expressionFuncs._M_h._M_single_bucket;
    std::
    _Function_handler<void_(wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DeadArgumentElimination.cpp:406:58)>
    ::_M_manager((_Any_data *)__dest,(_Any_data *)__dest,__destroy_functor);
  }
  if ((worthOptimizing._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0 & pDVar33->optimize) ==
      1) {
    OptUtils::optimizeAfterInlining
              ((FuncSet *)&hasUnseenCalls._M_h._M_single_bucket,(Module *)func,
               (pDVar33->super_Pass).runner);
  }
  _Var11._M_nxt = worthOptimizing._M_h._M_before_begin._M_nxt;
  _Var10._M_nxt = callTargetsToLocalize._M_h._M_before_begin._M_nxt;
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&tailCallees._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&hasUnseenCalls._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Name>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Name>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_1c0);
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_168);
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&scanner.info);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
               *)&worthOptimizing._M_h._M_single_bucket);
  if (scanner.
      super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
      super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
      super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.stack.fixed._M_elems[9]
      .currp != (Expression **)0x0) {
    operator_delete(scanner.
                    super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                    .super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                    super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.stack.
                    fixed._M_elems[9].currp,
                    (long)scanner.
                          super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                          .
                          super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>
                          .super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                          stack.flexible.
                          super__Vector_base<wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)scanner.
                          super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                          .
                          super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>
                          .super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                          stack.fixed._M_elems[9].currp);
  }
  bVar24 = (byte)local_80;
  Pass::~Pass((Pass *)local_4d8);
  return (bool)(_Var10._M_nxt != (_Hash_node_base *)0x0 |
               bVar24 | _Var11._M_nxt != (_Hash_node_base *)0x0);
}

Assistant:

bool iteration(Module* module, DAEFunctionInfoMap& infoMap) {
    allDroppedCalls.clear();

#if DAE_DEBUG
    // Enable this path to mark all contents as stale at the start of each
    // iteration, which can be used to check for staleness bugs (that is, bugs
    // where something should have been marked stale, but wasn't). Note, though,
    // that staleness bugs can easily cause serious issues with validation (e.g.
    // if data is stale we may miss that there is an additional caller, that
    // prevents refining argument types etc.), so this may not be terribly
    // helpful.
    if (getenv("ALWAYS_MARK_STALE")) {
      for (auto& [_, info] : infoMap) {
        info.markStale();
      }
    }
#endif

    DAEScanner scanner(&infoMap);
    scanner.walkModuleCode(module);
    // Scan all the functions.
    scanner.run(getPassRunner(), module);
    // Combine all the info.
    struct CallContext {
      Call* call;
      Function* func;
    };
    std::map<Name, std::vector<Call*>> allCalls;
    std::unordered_set<Name> tailCallees;
    std::unordered_set<Name> hasUnseenCalls;
    // Track the function in which relevant expressions exist. When we modify
    // those expressions we will need to mark the function's info as stale.
    std::unordered_map<Expression*, Name> expressionFuncs;
    for (auto& [func, info] : infoMap) {
      for (auto& [name, calls] : info.calls) {
        auto& allCallsToName = allCalls[name];
        allCallsToName.insert(allCallsToName.end(), calls.begin(), calls.end());
        for (auto* call : calls) {
          expressionFuncs[call] = func;
        }
      }
      for (auto& callee : info.tailCallees) {
        tailCallees.insert(callee);
      }
      for (auto& [call, dropp] : info.droppedCalls) {
        allDroppedCalls[call] = dropp;
      }
      for (auto& name : info.hasUnseenCalls) {
        hasUnseenCalls.insert(name);
      }
    }
    // Exports are considered unseen calls.
    for (auto& curr : module->exports) {
      if (curr->kind == ExternalKind::Function) {
        hasUnseenCalls.insert(*curr->getInternalName());
      }
    }

    // Track which functions we changed that are worth re-optimizing at the end.
    std::unordered_set<Function*> worthOptimizing;

    // If we refine return types then we will need to do more type updating
    // at the end.
    bool refinedReturnTypes = false;

    // If we find that localizing call arguments can help (by moving their
    // effects outside, so ParamUtils::removeParameters can handle them), then
    // we do that at the end and perform another cycle. It is simpler to just do
    // another cycle than to track the locations of calls, which is tricky as
    // localization might move a call (if a call happens to be another call's
    // param). In practice it is rare to find call arguments we want to remove,
    // and even more rare to find effects get in the way, so this should not
    // cause much overhead.
    //
    // This set tracks the functions for whom calls to it should be modified.
    std::unordered_set<Name> callTargetsToLocalize;

    // As we optimize, we mark things as stale.
    auto markStale = [&](Name func) {
      // We only ever mark functions stale (not the global scope, which we never
      // modify). An attempt to modify the global scope, identified by a null
      // function name, is a logic bug.
      assert(func.is());
      infoMap[func].markStale();
    };
    auto markCallersStale = [&](const std::vector<Call*>& calls) {
      for (auto* call : calls) {
        markStale(expressionFuncs[call]);
      }
    };

    // We now have a mapping of all call sites for each function, and can look
    // for optimization opportunities.
    for (auto& [name, calls] : allCalls) {
      // We can only optimize if we see all the calls and can modify them.
      if (hasUnseenCalls.count(name)) {
        continue;
      }
      auto* func = module->getFunction(name);
      // Refine argument types before doing anything else. This does not
      // affect whether an argument is used or not, it just refines the type
      // where possible.
      if (refineArgumentTypes(func, calls, module, infoMap[name])) {
        worthOptimizing.insert(func);
        markStale(func->name);
      }
      // Refine return types as well.
      if (refineReturnTypes(func, calls, module)) {
        refinedReturnTypes = true;
        markStale(func->name);
        markCallersStale(calls);
      }
      auto optimizedIndexes =
        ParamUtils::applyConstantValues({func}, calls, {}, module);
      for (auto i : optimizedIndexes) {
        // Mark it as unused, which we know it now is (no point to re-scan just
        // for that).
        infoMap[name].unusedParams.insert(i);
      }
      if (!optimizedIndexes.empty()) {
        markStale(func->name);
      }
    }
    if (refinedReturnTypes) {
      // Changing a call expression's return type can propagate out to its
      // parents, and so we must refinalize.
      // TODO: We could track in which functions we actually make changes.
      ReFinalize().run(getPassRunner(), module);
    }
    // We now know which parameters are unused, and can potentially remove them.
    for (auto& [name, calls] : allCalls) {
      if (hasUnseenCalls.count(name)) {
        continue;
      }
      auto* func = module->getFunction(name);
      auto numParams = func->getNumParams();
      if (numParams == 0) {
        continue;
      }
      auto [removedIndexes, outcome] = ParamUtils::removeParameters(
        {func}, infoMap[name].unusedParams, calls, {}, module, getPassRunner());
      if (!removedIndexes.empty()) {
        // Success!
        worthOptimizing.insert(func);
        markStale(func->name);
        markCallersStale(calls);
      }
      if (outcome == ParamUtils::RemovalOutcome::Failure) {
        callTargetsToLocalize.insert(name);
      }
    }
    // We can also tell which calls have all their return values dropped. Note
    // that we can't do this if we changed anything so far, as we may have
    // modified allCalls (we can't modify a call site twice in one iteration,
    // once to remove a param, once to drop the return value).
    if (worthOptimizing.empty()) {
      for (auto& func : module->functions) {
        if (func->getResults() == Type::none) {
          continue;
        }
        auto name = func->name;
        if (hasUnseenCalls.count(name)) {
          continue;
        }
        if (infoMap[name].hasTailCalls) {
          continue;
        }
        if (tailCallees.count(name)) {
          continue;
        }
        auto iter = allCalls.find(name);
        if (iter == allCalls.end()) {
          continue;
        }
        auto& calls = iter->second;
        bool allDropped =
          std::all_of(calls.begin(), calls.end(), [&](Call* call) {
            return allDroppedCalls.count(call);
          });
        if (!allDropped) {
          continue;
        }
        if (removeReturnValue(func.get(), calls, module)) {
          // We should optimize the callers.
          for (auto* call : calls) {
            worthOptimizing.insert(module->getFunction(expressionFuncs[call]));
          }
        }
        // TODO Removing a drop may also open optimization opportunities in the
        // callers.
        worthOptimizing.insert(func.get());
        markStale(func->name);
        markCallersStale(calls);
      }
    }
    if (!callTargetsToLocalize.empty()) {
      ParamUtils::localizeCallsTo(
        callTargetsToLocalize, *module, getPassRunner(), [&](Function* func) {
          markStale(func->name);
        });
    }
    if (optimize && !worthOptimizing.empty()) {
      OptUtils::optimizeAfterInlining(worthOptimizing, module, getPassRunner());
    }

    return !worthOptimizing.empty() || refinedReturnTypes ||
           !callTargetsToLocalize.empty();
  }